

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_playback(Pager *pPager,int isHot)

{
  undefined4 uVar1;
  int iVar2;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Pager *unaff_retaddr;
  int nPlayback;
  int needPagerReset;
  char *zSuper;
  int rc;
  u32 u;
  sqlite3_vfs *pVfs;
  u32 savedPageSize;
  int res;
  Pgno mxPg;
  u32 nRec;
  i64 szJ;
  undefined4 in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffac;
  uint uVar3;
  int flags;
  sqlite3_file *psVar4;
  uint nPage;
  Pager *pPager_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  uint isSavepnt;
  uint isMainJrnl;
  Bitvec *pDone;
  i64 *pOffset;
  
  pOffset = *(i64 **)(in_FS_OFFSET + 0x28);
  pPager_00 = (Pager *)*in_RDI;
  pDone = (Bitvec *)&DAT_aaaaaaaaaaaaaaaa;
  isMainJrnl = 0xaaaaaaaa;
  nPage = 0xaaaaaaaa;
  isSavepnt = 0;
  iVar5 = 1;
  psVar4 = (sqlite3_file *)0x0;
  flags = -0x55555556;
  uVar3 = 0;
  uVar1 = (undefined4)in_RDI[0x19];
  iVar2 = sqlite3OsFileSize((sqlite3_file *)0xaaaaaaaa00000000,
                            (i64 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (iVar2 == 0) {
    psVar4 = (sqlite3_file *)in_RDI[0x23];
    iVar2 = readSuperJournal(psVar4,(char *)CONCAT44(flags,uVar3),in_stack_ffffffffffffffac);
    if ((iVar2 == 0) && (*(char *)&psVar4->pMethods != '\0')) {
      iVar2 = sqlite3OsAccess((sqlite3_vfs *)((ulong)nPage << 0x20),(char *)psVar4,flags,
                              (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    psVar4 = (sqlite3_file *)0x0;
    if ((iVar2 == 0) && (iVar5 != 0)) {
      in_RDI[0xc] = 0;
      iVar2 = 0;
      flags = in_ESI;
LAB_00162ce0:
      iVar2 = readJournalHdr((Pager *)CONCAT44(iVar5,uVar1),(int)((ulong)in_RDI >> 0x20),
                             CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(u32 *)pPager_00,
                             (u32 *)CONCAT44(nPage,iVar2));
      if (iVar2 == 0) {
        if (isMainJrnl == 0xffffffff) {
          isMainJrnl = (uint)((long)((long)pDone - (ulong)*(uint *)(in_RDI + 0x17)) /
                             (in_RDI[0x19] + 8));
        }
        if (((isMainJrnl == 0) && (in_ESI == 0)) &&
           (in_RDI[0xd] + (ulong)*(uint *)(in_RDI + 0x17) == in_RDI[0xc])) {
          isMainJrnl = (uint)(((long)pDone - in_RDI[0xc]) / (in_RDI[0x19] + 8));
        }
        if (in_RDI[0xc] == (ulong)*(uint *)(in_RDI + 0x17)) {
          iVar2 = pager_truncate(pPager_00,nPage);
          if (iVar2 != 0) goto LAB_00162eb5;
          *(uint *)(in_RDI + 4) = isSavepnt;
          if (*(uint *)((long)in_RDI + 0xbc) < isSavepnt) {
            *(uint *)((long)in_RDI + 0xbc) = isSavepnt;
          }
        }
        iVar2 = 0;
        for (nPage = 0; nPage < isMainJrnl; nPage = nPage + 1) {
          if (flags != 0) {
            pager_reset((Pager *)0x162e32);
            flags = 0;
          }
          iVar2 = pager_playback_one_page(unaff_retaddr,pOffset,pDone,isMainJrnl,isSavepnt);
          if (iVar2 != 0) {
            if (iVar2 != 0x65) {
              if (iVar2 == 0x20a) {
                iVar2 = 0;
              }
              goto LAB_00162eb5;
            }
            in_RDI[0xc] = pDone;
            break;
          }
          uVar3 = uVar3 + 1;
        }
        goto LAB_00162ce0;
      }
      if (iVar2 == 0x65) {
        iVar2 = 0;
      }
    }
  }
LAB_00162eb5:
  if (iVar2 == 0) {
    iVar2 = sqlite3PagerSetPagesize
                      ((Pager *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(u32 *)pPager_00,nPage);
  }
  *(undefined1 *)((long)in_RDI + 0x17) = *(undefined1 *)(in_RDI + 2);
  if (iVar2 == 0) {
    psVar4 = (sqlite3_file *)(in_RDI[0x23] + 4);
    iVar2 = readSuperJournal(psVar4,(char *)CONCAT44(flags,uVar3),in_stack_ffffffffffffffac);
  }
  if ((iVar2 == 0) &&
     ((3 < *(byte *)((long)in_RDI + 0x15) || (*(char *)((long)in_RDI + 0x15) == '\0')))) {
    iVar2 = sqlite3PagerSync((Pager *)((ulong)nPage << 0x20),(char *)psVar4);
  }
  if (iVar2 == 0) {
    iVar2 = pager_end_transaction(pPager_00,nPage,0);
  }
  if (((iVar2 == 0) && (*(char *)&psVar4->pMethods != '\0')) && (iVar5 != 0)) {
    memset((void *)in_RDI[0x23],0,4);
    iVar2 = pager_delsuper(_nPlayback,(char *)unaff_retaddr);
  }
  if ((in_ESI != 0) && (uVar3 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar3,in_RDI[0x1c]);
  }
  setSectorSize((Pager *)0x163005);
  if (*(i64 **)(in_FS_OFFSET + 0x28) != pOffset) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zSuper = 0;        /* Name of super-journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the super-journal name from the journal, if it is present.
  ** If a super-journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zSuper = pPager->pTmpSpace;
  rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zSuper[0] ){
    rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
  }
  zSuper = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error
  ** occurs.
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
      if( pPager->mxPgno<mxPg ){
        pPager->mxPgno = mxPg;
      }
    }

    /* Copy original pages out of the journal and back into the
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or
  ** malloc error that occurred after the change-counter was updated but
  ** before the transaction was committed, then the change-counter
  ** modification may just have been reverted. If this happens in exclusive
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    /* Leave 4 bytes of space before the super-journal filename in memory.
    ** This is because it may end up being passed to sqlite3OsOpen(), in
    ** which case it requires 4 0x00 bytes in memory immediately before
    ** the filename. */
    zSuper = &pPager->pTmpSpace[4];
    rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zSuper[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zSuper[0] && res ){
    /* If there was a super-journal and this routine will return success,
    ** see if it is possible to delete the super-journal.
    */
    assert( zSuper==&pPager->pTmpSpace[4] );
    memset(pPager->pTmpSpace, 0, 4);
    rc = pager_delsuper(pPager, zSuper);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}